

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<0ul,char_const(&)[6]>
          (Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
           *this,char (*params) [7])

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  size_t in_RDX;
  long lVar8;
  uint uVar9;
  StringPtr str;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  undefined8 local_38;
  ulong uVar10;
  
  lVar8 = 0;
  if (*(long *)(params + 8) != 0) {
    lVar3 = *(long *)params;
    str.content.size_ = in_RDX;
    str.content.ptr = (char *)0x6;
    uVar6 = _::anon_unknown_0::StringHasher::hashCode((StringHasher *)"corge",str);
    lVar7 = *(long *)(params + 8);
    uVar9 = (int)lVar7 - 1U & uVar6;
    while( true ) {
      uVar10 = (ulong)uVar9;
      lVar4 = *(long *)(params[6] + 6);
      iVar2 = *(int *)(lVar4 + 4 + uVar10 * 8);
      if (iVar2 == 0) break;
      if ((iVar2 != 1) && (*(uint *)(lVar4 + uVar10 * 8) == uVar6)) {
        lVar7 = (ulong)(iVar2 - 2) * 0x18;
        local_38 = *(undefined8 *)(lVar3 + 0x10 + lVar7);
        puVar1 = (undefined8 *)(lVar3 + lVar7);
        local_48.ptr = (char *)*puVar1;
        local_48.size_ = puVar1[1];
        local_58.ptr = "corge";
        local_58.size_ = 6;
        bVar5 = ArrayPtr<const_char>::operator==(&local_48,&local_58);
        if (bVar5) {
          lVar8 = (ulong)(*(int *)(lVar4 + 4 + uVar10 * 8) - 2) * 0x18 + *(long *)params;
          break;
        }
        lVar7 = *(long *)(params + 8);
      }
      uVar9 = (uint)(uVar10 + 1);
      if (uVar10 + 1 == lVar7) {
        uVar9 = 0;
      }
    }
  }
  *(long *)this = lVar8;
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}